

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brkiter.cpp
# Opt level: O3

void __thiscall
icu_63::ICUBreakIteratorService::ICUBreakIteratorService(ICUBreakIteratorService *this)

{
  ICUResourceBundleFactory *this_00;
  UnicodeString *dname;
  UErrorCode status;
  ConstChar16Ptr local_70;
  char16_t *local_68;
  UnicodeString local_58;
  
  local_70.p_ = L"Break Iterator";
  UnicodeString::UnicodeString(&local_58,'\x01',&local_70,0xe);
  dname = &local_58;
  ICULocaleService::ICULocaleService(&this->super_ICULocaleService,dname);
  UnicodeString::~UnicodeString(&local_58);
  local_68 = local_70.p_;
  (this->super_ICULocaleService).super_ICUService.super_ICUNotifier._vptr_ICUNotifier =
       (_func_int **)&PTR__ICUBreakIteratorService_003da360;
  local_58.super_Replaceable.super_UObject._vptr_UObject._0_4_ = 0;
  this_00 = (ICUResourceBundleFactory *)UMemory::operator_new((UMemory *)0x90,(size_t)dname);
  if (this_00 != (ICUResourceBundleFactory *)0x0) {
    memset(this_00,0,0x90);
    ICUResourceBundleFactory::ICUResourceBundleFactory(this_00);
    (this_00->super_LocaleKeyFactory).super_ICUServiceFactory.super_UObject._vptr_UObject =
         (_func_int **)&PTR__ICUBreakIteratorFactory_003da2f0;
  }
  (*(this->super_ICULocaleService).super_ICUService.super_ICUNotifier._vptr_ICUNotifier[9])
            (this,this_00,&local_58);
  return;
}

Assistant:

ICUBreakIteratorService()
        : ICULocaleService(UNICODE_STRING("Break Iterator", 14))
    {
        UErrorCode status = U_ZERO_ERROR;
        registerFactory(new ICUBreakIteratorFactory(), status);
    }